

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
* generatePalettes(tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
                   *__return_storage_ptr__,
                  vector<ProtoPalette,_std::allocator<ProtoPalette>_> *protoPalettes,Png *png)

{
  FILE *__stream;
  value_type *pvVar1;
  pointer pPVar2;
  pointer pPVar3;
  bool bVar4;
  __tuple_element_t<0UL,_tuple<vector<unsigned_long,_default_init_allocator<unsigned_long,_allocator<unsigned_long>_>_>,_unsigned_long>_>
  *this;
  __tuple_element_t<1UL,_tuple<vector<unsigned_long,_default_init_allocator<unsigned_long,_allocator<unsigned_long>_>_>,_unsigned_long>_>
  *p_Var5;
  size_type sVar6;
  size_type sVar7;
  pointer pPVar8;
  reference pvVar9;
  reference pvVar10;
  value_type *pvVar11;
  __tuple_element_t<0UL,_tuple<int,_const_png_color_struct_*,_unsigned_char_*>_> *p_Var12;
  __tuple_element_t<1UL,_tuple<int,_const_png_color_struct_*,_unsigned_char_*>_> *pppVar13;
  __tuple_element_t<2UL,_tuple<int,_const_png_color_struct_*,_unsigned_char_*>_> *ppuVar14;
  ImagePalette *this_00;
  array<std::optional<Rgba>,_32769UL> *colors;
  char *pcVar15;
  type *embPalAlpha;
  type *embPalRGB;
  type_conflict5 *embPalSize;
  uint16_t local_d2;
  const_iterator pvStack_d0;
  uint16_t color;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  value_type *__range2_1;
  value_type *pal_1;
  size_t protoPalID;
  Palette *pal;
  iterator __end2;
  iterator __begin2;
  vector<Palette,_std::allocator<Palette>_> *__range2;
  allocator<Palette> local_71;
  undefined1 local_70 [8];
  vector<Palette,_std::allocator<Palette>_> palettes;
  size_t i;
  type_conflict1 *nbPalettes;
  type *mappings;
  Png *local_20;
  Png *png_local;
  vector<ProtoPalette,_std::allocator<ProtoPalette>_> *protoPalettes_local;
  
  local_20 = png;
  png_local = (Png *)protoPalettes;
  protoPalettes_local =
       (vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)__return_storage_ptr__;
  packing::overloadAndRemove
            ((tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
              *)&mappings,protoPalettes);
  this = std::
         get<0ul,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                   ((tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                     *)&mappings);
  p_Var5 = std::
           get<1ul,std::vector<unsigned_long,default_init_allocator<unsigned_long,std::allocator<unsigned_long>>>,unsigned_long>
                     ((tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
                       *)&mappings);
  sVar6 = std::
          vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::size(this);
  sVar7 = std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::size
                    ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)png_local);
  if (sVar6 != sVar7) {
    __assert_fail("mappings.size() == protoPalettes.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/gfx/process.cpp"
                  ,0x218,"generatePalettes");
  }
  if (2 < options.verbosity) {
    pcVar15 = "";
    if (*p_Var5 != 1) {
      pcVar15 = "s";
    }
    fprintf(_stderr,"Proto-palette mappings: (%zu palette%s)\n",*p_Var5,pcVar15);
    for (palettes.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pPVar2 = palettes.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,
        pPVar8 = (pointer)std::
                          vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                          ::size(this),
        pPVar3 = palettes.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage, __stream = _stderr, pPVar2 < pPVar8;
        palettes.super__Vector_base<Palette,_std::allocator<Palette>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             (pointer)((long)((palettes.super__Vector_base<Palette,_std::allocator<Palette>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage)->colors)._M_elems
                      + 1)) {
      pvVar9 = std::
               vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator[](this,(size_type)
                                 palettes.super__Vector_base<Palette,_std::allocator<Palette>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      fprintf(__stream,"%zu -> %zu\n",pPVar3,*pvVar9);
    }
  }
  sVar6 = *p_Var5;
  std::allocator<Palette>::allocator(&local_71);
  std::vector<Palette,_std::allocator<Palette>_>::vector
            ((vector<Palette,_std::allocator<Palette>_> *)local_70,sVar6,&local_71);
  std::allocator<Palette>::~allocator(&local_71);
  if ((options.hasTransparentPixels & 1U) != 0) {
    __end2 = std::vector<Palette,_std::allocator<Palette>_>::begin
                       ((vector<Palette,_std::allocator<Palette>_> *)local_70);
    pal = (Palette *)
          std::vector<Palette,_std::allocator<Palette>_>::end
                    ((vector<Palette,_std::allocator<Palette>_> *)local_70);
    while (bVar4 = __gnu_cxx::operator==<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>
                             (&__end2,(__normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>
                                       *)&pal), ((bVar4 ^ 0xffU) & 1) != 0) {
      protoPalID = (size_t)__gnu_cxx::
                           __normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>
                           ::operator*(&__end2);
      pvVar10 = std::array<unsigned_short,_4UL>::operator[]
                          ((array<unsigned_short,_4UL> *)protoPalID,0);
      *pvVar10 = 0x8000;
      __gnu_cxx::__normal_iterator<Palette_*,_std::vector<Palette,_std::allocator<Palette>_>_>::
      operator++(&__end2);
    }
  }
  for (pal_1 = (value_type *)0x0; pvVar1 = pal_1,
      pvVar11 = (value_type *)
                std::
                vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
                ::size(this), pvVar1 < pvVar11;
      pal_1 = (value_type *)((long)(pal_1->colors)._M_elems + 1)) {
    pvVar9 = std::
             vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator[](this,(size_type)pal_1);
    __range2_1 = (value_type *)
                 std::vector<Palette,_std::allocator<Palette>_>::operator[]
                           ((vector<Palette,_std::allocator<Palette>_> *)local_70,*pvVar9);
    __begin2_1 = (const_iterator)
                 std::vector<ProtoPalette,_std::allocator<ProtoPalette>_>::operator[]
                           ((vector<ProtoPalette,_std::allocator<ProtoPalette>_> *)png_local,
                            (size_type)pal_1);
    __end2_1 = ProtoPalette::begin((ProtoPalette *)__begin2_1);
    pvStack_d0 = ProtoPalette::end((ProtoPalette *)__begin2_1);
    for (; __end2_1 != pvStack_d0; __end2_1 = __end2_1 + 1) {
      local_d2 = *__end2_1;
      Palette::addColor((Palette *)__range2_1,local_d2);
    }
  }
  Png::getEmbeddedPal((tuple<int,_const_png_color_struct_*,_unsigned_char_*> *)&embPalSize,local_20)
  ;
  p_Var12 = std::get<0ul,int,png_color_struct_const*,unsigned_char*>
                      ((tuple<int,_const_png_color_struct_*,_unsigned_char_*> *)&embPalSize);
  pppVar13 = std::get<1ul,int,png_color_struct_const*,unsigned_char*>
                       ((tuple<int,_const_png_color_struct_*,_unsigned_char_*> *)&embPalSize);
  ppuVar14 = std::get<2ul,int,png_color_struct_const*,unsigned_char*>
                       ((tuple<int,_const_png_color_struct_*,_unsigned_char_*> *)&embPalSize);
  if (*pppVar13 ==
      (__tuple_element_t<1UL,_tuple<int,_const_png_color_struct_*,_unsigned_char_*>_>)0x0) {
    bVar4 = Png::isSuitableForGrayscale(local_20);
    if (bVar4) {
      this_00 = Png::getColors(local_20);
      colors = ImagePalette::raw(this_00);
      sorting::grayscale((vector<Palette,_std::allocator<Palette>_> *)local_70,colors);
    }
    else {
      sorting::rgb((vector<Palette,_std::allocator<Palette>_> *)local_70);
    }
  }
  else {
    sorting::indexed((vector<Palette,_std::allocator<Palette>_> *)local_70,*p_Var12,*pppVar13,
                     *ppuVar14);
  }
  std::
  tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::vector<Palette,_std::allocator<Palette>_>_>
  ::
  tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>_&,_std::vector<Palette,_std::allocator<Palette>_>_&,_true>
            (__return_storage_ptr__,this,(vector<Palette,_std::allocator<Palette>_> *)local_70);
  std::vector<Palette,_std::allocator<Palette>_>::~vector
            ((vector<Palette,_std::allocator<Palette>_> *)local_70);
  std::
  tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
  ::~tuple((tuple<std::vector<unsigned_long,_default_init_allocator<unsigned_long,_std::allocator<unsigned_long>_>_>,_unsigned_long>
            *)&mappings);
  return __return_storage_ptr__;
}

Assistant:

static std::tuple<DefaultInitVec<size_t>, std::vector<Palette>>
    generatePalettes(std::vector<ProtoPalette> const &protoPalettes, Png const &png) {
	// Run a "pagination" problem solver
	// TODO: allow picking one of several solvers?
	auto [mappings, nbPalettes] = packing::overloadAndRemove(protoPalettes);
	assert(mappings.size() == protoPalettes.size());

	if (options.verbosity >= Options::VERB_INTERM) {
		fprintf(stderr, "Proto-palette mappings: (%zu palette%s)\n", nbPalettes,
		        nbPalettes != 1 ? "s" : "");
		for (size_t i = 0; i < mappings.size(); ++i) {
			fprintf(stderr, "%zu -> %zu\n", i, mappings[i]);
		}
	}

	std::vector<Palette> palettes(nbPalettes);
	// If the image contains at least one transparent pixel, force transparency in the first slot of
	// all palettes
	if (options.hasTransparentPixels) {
		for (Palette &pal : palettes) {
			pal.colors[0] = Rgba::transparent;
		}
	}
	// Generate the actual palettes from the mappings
	for (size_t protoPalID = 0; protoPalID < mappings.size(); ++protoPalID) {
		auto &pal = palettes[mappings[protoPalID]];
		for (uint16_t color : protoPalettes[protoPalID]) {
			pal.addColor(color);
		}
	}

	// "Sort" colors in the generated palettes, see the man page for the flowchart
	auto [embPalSize, embPalRGB, embPalAlpha] = png.getEmbeddedPal();
	if (embPalRGB != nullptr) {
		sorting::indexed(palettes, embPalSize, embPalRGB, embPalAlpha);
	} else if (png.isSuitableForGrayscale()) {
		sorting::grayscale(palettes, png.getColors().raw());
	} else {
		sorting::rgb(palettes);
	}
	return {mappings, palettes};
}